

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

string * __thiscall
Assimp::B3DImporter::ReadString_abi_cxx11_(string *__return_storage_ptr__,B3DImporter *this)

{
  int iVar1;
  B3DImporter *this_00;
  _Alloc_hider local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  undefined1 local_40 [32];
  
  local_58 = 0;
  local_50 = '\0';
  local_60._M_p = &local_50;
  while( true ) {
    if ((ulong)((long)(this->_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) <= (ulong)this->_pos) {
      local_40._0_8_ = local_40 + 0x10;
      this_00 = (B3DImporter *)local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"EOF","");
      Fail(this_00,(string *)local_40);
    }
    iVar1 = ReadByte(this);
    if (iVar1 == 0) break;
    std::__cxx11::string::push_back((char)&local_60);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_60._M_p == &local_50) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_48;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_60._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
  }
  __return_storage_ptr__->_M_string_length = local_58;
  return __return_storage_ptr__;
}

Assistant:

string B3DImporter::ReadString(){
    string str;
    while( _pos<_buf.size() ){
        char c=(char)ReadByte();
        if( !c ) {
            return str;
        }
        str+=c;
    }
    Fail( "EOF" );
    return string();
}